

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O3

QCborValue * __thiscall
QCborContainerPrivate::valueAt
          (QCborValue *__return_storage_ptr__,QCborContainerPrivate *this,qsizetype idx)

{
  Element *pEVar1;
  uint uVar2;
  Type TVar3;
  Element *pEVar4;
  anon_union_8_2_4ee71171_for_Element_0 aVar5;
  QCborContainerPrivate *pQVar6;
  QCborValue *result;
  
  pEVar4 = (this->elements).d.ptr;
  pEVar1 = pEVar4 + idx;
  uVar2 = pEVar4[idx].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  if ((uVar2 & 1) == 0) {
    TVar3 = pEVar1->type;
    if ((uVar2 & 2) == 0) {
      aVar5 = pEVar1->field_0;
      *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->t = TVar3;
      __return_storage_ptr__->n = (qint64)aVar5;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      return __return_storage_ptr__;
    }
    *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->t = TVar3;
    __return_storage_ptr__->n = idx;
    __return_storage_ptr__->container = this;
    LOCK();
    (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    return __return_storage_ptr__;
  }
  TVar3 = pEVar1->type;
  pQVar6 = (pEVar1->field_0).container;
  if (TVar3 == Tag) {
    if ((pQVar6->elements).d.size != 2) {
      *(undefined8 *)&__return_storage_ptr__->t = 0xaaaaaaaaffffffff;
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      return __return_storage_ptr__;
    }
    *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->t = Tag;
    __return_storage_ptr__->n = -1;
    __return_storage_ptr__->container = pQVar6;
  }
  else {
    *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->t = TVar3;
    __return_storage_ptr__->n = -1;
    __return_storage_ptr__->container = pQVar6;
    if (pQVar6 == (QCborContainerPrivate *)0x0) {
      return __return_storage_ptr__;
    }
  }
  LOCK();
  (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return __return_storage_ptr__;
}

Assistant:

QCborValue valueAt(qsizetype idx) const
    {
        const auto &e = elements.at(idx);

        if (e.flags & QtCbor::Element::IsContainer) {
            if (e.type == QCborValue::Tag && e.container->elements.size() != 2) {
                // invalid tags can be created due to incomplete parsing
                return makeValue(QCborValue::Invalid, 0, nullptr);
            }
            return makeValue(e.type, -1, e.container);
        } else if (e.flags & QtCbor::Element::HasByteData) {
            return makeValue(e.type, idx, const_cast<QCborContainerPrivate *>(this));
        }
        return makeValue(e.type, e.value);
    }